

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  ulong uVar20;
  byte bVar21;
  long lVar22;
  ulong uVar23;
  ulong *puVar24;
  byte bVar25;
  byte bVar26;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  ulong uVar30;
  NodeRef root;
  undefined1 (*pauVar31) [32];
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar35 [16];
  undefined1 auVar47 [32];
  undefined1 auVar36 [16];
  undefined1 auVar48 [32];
  undefined1 auVar37 [16];
  undefined1 auVar49 [32];
  undefined1 auVar38 [16];
  undefined1 auVar50 [32];
  undefined1 auVar39 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  Precalculations pre;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5ac1;
  RayQueryContext *local_5ac0;
  undefined4 local_5ab4;
  ulong local_5ab0;
  size_t local_5aa8;
  ulong local_5aa0;
  BVH *local_5a98;
  Intersectors *local_5a90;
  RayK<8> *local_5a88;
  undefined4 local_5a80;
  undefined4 uStack_5a7c;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined1 local_5a60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  int local_58c0;
  int iStack_58bc;
  int iStack_58b8;
  int iStack_58b4;
  int iStack_58b0;
  int iStack_58ac;
  int iStack_58a8;
  int iStack_58a4;
  uint local_58a0;
  uint uStack_589c;
  uint uStack_5898;
  uint uStack_5894;
  uint uStack_5890;
  uint uStack_588c;
  uint uStack_5888;
  uint uStack_5884;
  uint local_5880;
  uint uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  
  local_5a98 = (BVH *)This->ptr;
  local_5808 = (local_5a98->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar42 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar34 = ZEXT816(0) << 0x40;
      uVar33 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar34),5);
      uVar30 = vpcmpeqd_avx512vl(auVar42,(undefined1  [32])valid_i->field_0);
      uVar33 = uVar33 & uVar30;
      bVar21 = (byte)uVar33;
      if (bVar21 != 0) {
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar44._8_4_ = 0x7fffffff;
        auVar44._0_8_ = 0x7fffffff7fffffff;
        auVar44._12_4_ = 0x7fffffff;
        auVar44._16_4_ = 0x7fffffff;
        auVar44._20_4_ = 0x7fffffff;
        auVar44._24_4_ = 0x7fffffff;
        auVar44._28_4_ = 0x7fffffff;
        auVar42 = vandps_avx(auVar44,local_59e0);
        auVar40._8_4_ = 0x219392ef;
        auVar40._0_8_ = 0x219392ef219392ef;
        auVar40._12_4_ = 0x219392ef;
        auVar40._16_4_ = 0x219392ef;
        auVar40._20_4_ = 0x219392ef;
        auVar40._24_4_ = 0x219392ef;
        auVar40._28_4_ = 0x219392ef;
        uVar30 = vcmpps_avx512vl(auVar42,auVar40,1);
        bVar32 = (bool)((byte)uVar30 & 1);
        auVar41._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59e0._0_4_;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59e0._4_4_;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59e0._8_4_;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59e0._12_4_;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59e0._16_4_;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59e0._20_4_;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59e0._24_4_;
        bVar32 = SUB81(uVar30 >> 7,0);
        auVar41._28_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59e0._28_4_;
        auVar42 = vandps_avx(auVar44,local_59c0);
        uVar30 = vcmpps_avx512vl(auVar42,auVar40,1);
        bVar32 = (bool)((byte)uVar30 & 1);
        auVar45._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59c0._0_4_;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59c0._4_4_;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59c0._8_4_;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59c0._12_4_;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59c0._16_4_;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59c0._20_4_;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59c0._24_4_;
        bVar32 = SUB81(uVar30 >> 7,0);
        auVar45._28_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59c0._28_4_;
        auVar42 = vandps_avx(auVar44,local_59a0);
        uVar30 = vcmpps_avx512vl(auVar42,auVar40,1);
        bVar32 = (bool)((byte)uVar30 & 1);
        auVar42._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59a0._0_4_;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59a0._4_4_;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59a0._8_4_;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59a0._12_4_;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59a0._16_4_;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59a0._20_4_;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59a0._24_4_;
        bVar32 = SUB81(uVar30 >> 7,0);
        auVar42._28_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * local_59a0._28_4_;
        auVar43._8_4_ = 0x3f800000;
        auVar43._0_8_ = 0x3f8000003f800000;
        auVar43._12_4_ = 0x3f800000;
        auVar43._16_4_ = 0x3f800000;
        auVar43._20_4_ = 0x3f800000;
        auVar43._24_4_ = 0x3f800000;
        auVar43._28_4_ = 0x3f800000;
        auVar40 = vrcp14ps_avx512vl(auVar41);
        auVar35 = vfnmadd213ps_fma(auVar41,auVar40,auVar43);
        auVar35 = vfmadd132ps_fma(ZEXT1632(auVar35),auVar40,auVar40);
        auVar41 = vrcp14ps_avx512vl(auVar45);
        auVar36 = vfnmadd213ps_fma(auVar45,auVar41,auVar43);
        auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar41,auVar41);
        auVar41 = vrcp14ps_avx512vl(auVar42);
        auVar37 = vfnmadd213ps_fma(auVar42,auVar41,auVar43);
        local_5980 = ZEXT1632(auVar35);
        local_5960 = ZEXT1632(auVar36);
        auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar41,auVar41);
        local_5940 = ZEXT1632(auVar37);
        local_5920 = (float)local_5a40._0_4_ * auVar35._0_4_;
        fStack_591c = (float)local_5a40._4_4_ * auVar35._4_4_;
        fStack_5918 = (float)local_5a40._8_4_ * auVar35._8_4_;
        fStack_5914 = (float)local_5a40._12_4_ * auVar35._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar36._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar36._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar36._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar36._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar37._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar37._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar37._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar37._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        uVar30 = vcmpps_avx512vl(ZEXT1632(auVar35),ZEXT1632(auVar34),1);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_58c0 = (uint)((byte)uVar30 & 1) * auVar42._0_4_;
        iStack_58bc = (uint)((byte)(uVar30 >> 1) & 1) * auVar42._4_4_;
        iStack_58b8 = (uint)((byte)(uVar30 >> 2) & 1) * auVar42._8_4_;
        iStack_58b4 = (uint)((byte)(uVar30 >> 3) & 1) * auVar42._12_4_;
        iStack_58b0 = (uint)((byte)(uVar30 >> 4) & 1) * auVar42._16_4_;
        iStack_58ac = (uint)((byte)(uVar30 >> 5) & 1) * auVar42._20_4_;
        iStack_58a8 = (uint)((byte)(uVar30 >> 6) & 1) * auVar42._24_4_;
        iStack_58a4 = (uint)(byte)(uVar30 >> 7) * auVar42._28_4_;
        auVar41 = ZEXT1632(auVar34);
        uVar30 = vcmpps_avx512vl(ZEXT1632(auVar36),auVar41,5);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar32 = (bool)((byte)uVar30 & 1);
        local_58a0 = (uint)bVar32 * auVar42._0_4_ | (uint)!bVar32 * 0x60;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        uStack_589c = (uint)bVar32 * auVar42._4_4_ | (uint)!bVar32 * 0x60;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        uStack_5898 = (uint)bVar32 * auVar42._8_4_ | (uint)!bVar32 * 0x60;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        uStack_5894 = (uint)bVar32 * auVar42._12_4_ | (uint)!bVar32 * 0x60;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        uStack_5890 = (uint)bVar32 * auVar42._16_4_ | (uint)!bVar32 * 0x60;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        uStack_588c = (uint)bVar32 * auVar42._20_4_ | (uint)!bVar32 * 0x60;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        uStack_5888 = (uint)bVar32 * auVar42._24_4_ | (uint)!bVar32 * 0x60;
        bVar32 = SUB81(uVar30 >> 7,0);
        uStack_5884 = (uint)bVar32 * auVar42._28_4_ | (uint)!bVar32 * 0x60;
        uVar30 = vcmpps_avx512vl(ZEXT1632(auVar37),auVar41,5);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar32 = (bool)((byte)uVar30 & 1);
        local_5880 = (uint)bVar32 * auVar42._0_4_ | (uint)!bVar32 * 0xa0;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        uStack_587c = (uint)bVar32 * auVar42._4_4_ | (uint)!bVar32 * 0xa0;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        uStack_5878 = (uint)bVar32 * auVar42._8_4_ | (uint)!bVar32 * 0xa0;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        uStack_5874 = (uint)bVar32 * auVar42._12_4_ | (uint)!bVar32 * 0xa0;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        uStack_5870 = (uint)bVar32 * auVar42._16_4_ | (uint)!bVar32 * 0xa0;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        uStack_586c = (uint)bVar32 * auVar42._20_4_ | (uint)!bVar32 * 0xa0;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        uStack_5868 = (uint)bVar32 * auVar42._24_4_ | (uint)!bVar32 * 0xa0;
        bVar32 = SUB81(uVar30 >> 7,0);
        uStack_5864 = (uint)bVar32 * auVar42._28_4_ | (uint)!bVar32 * 0xa0;
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar65 = ZEXT3264(local_4680);
        auVar42 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar41);
        local_5860 = (uint)(bVar21 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar21 & 1) * 0x7f800000;
        bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
        uStack_585c = (uint)bVar32 * auVar42._4_4_ | (uint)!bVar32 * 0x7f800000;
        bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
        uStack_5858 = (uint)bVar32 * auVar42._8_4_ | (uint)!bVar32 * 0x7f800000;
        bVar32 = (bool)((byte)(uVar33 >> 3) & 1);
        uStack_5854 = (uint)bVar32 * auVar42._12_4_ | (uint)!bVar32 * 0x7f800000;
        bVar32 = (bool)((byte)(uVar33 >> 4) & 1);
        uStack_5850 = (uint)bVar32 * auVar42._16_4_ | (uint)!bVar32 * 0x7f800000;
        bVar32 = (bool)((byte)(uVar33 >> 5) & 1);
        uStack_584c = (uint)bVar32 * auVar42._20_4_ | (uint)!bVar32 * 0x7f800000;
        bVar32 = (bool)((byte)(uVar33 >> 6) & 1);
        uStack_5848 = (uint)bVar32 * auVar42._24_4_ | (uint)!bVar32 * 0x7f800000;
        bVar32 = SUB81(uVar33 >> 7,0);
        uStack_5844 = (uint)bVar32 * auVar42._28_4_ | (uint)!bVar32 * 0x7f800000;
        local_5ab4 = (undefined4)uVar33;
        auVar42 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar41);
        local_5840 = (uint)(bVar21 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar21 & 1) * -0x800000;
        bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
        uStack_583c = (uint)bVar32 * auVar42._4_4_ | (uint)!bVar32 * -0x800000;
        bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
        uStack_5838 = (uint)bVar32 * auVar42._8_4_ | (uint)!bVar32 * -0x800000;
        bVar32 = (bool)((byte)(uVar33 >> 3) & 1);
        uStack_5834 = (uint)bVar32 * auVar42._12_4_ | (uint)!bVar32 * -0x800000;
        bVar32 = (bool)((byte)(uVar33 >> 4) & 1);
        uStack_5830 = (uint)bVar32 * auVar42._16_4_ | (uint)!bVar32 * -0x800000;
        bVar32 = (bool)((byte)(uVar33 >> 5) & 1);
        uStack_582c = (uint)bVar32 * auVar42._20_4_ | (uint)!bVar32 * -0x800000;
        bVar32 = (bool)((byte)(uVar33 >> 6) & 1);
        uStack_5828 = (uint)bVar32 * auVar42._24_4_ | (uint)!bVar32 * -0x800000;
        bVar32 = SUB81(uVar33 >> 7,0);
        uStack_5824 = (uint)bVar32 * auVar42._28_4_ | (uint)!bVar32 * -0x800000;
        uVar33 = (ulong)(byte)~bVar21;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar30 = 7;
        }
        else {
          uVar30 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5a88 = ray + 0x100;
        puVar24 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar31 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        uStack_465c = uStack_585c;
        uStack_4658 = uStack_5858;
        uStack_4654 = uStack_5854;
        uStack_4650 = uStack_5850;
        uStack_464c = uStack_584c;
        uStack_4648 = uStack_5848;
        uStack_4644 = uStack_5844;
        local_5ac0 = context;
        local_5a90 = This;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_007c18f3:
        do {
          auVar46._4_4_ = uStack_583c;
          auVar46._0_4_ = local_5840;
          auVar46._8_4_ = uStack_5838;
          auVar46._12_4_ = uStack_5834;
          auVar46._16_4_ = uStack_5830;
          auVar46._20_4_ = uStack_582c;
          auVar46._24_4_ = uStack_5828;
          auVar46._28_4_ = uStack_5824;
          do {
            root.ptr = puVar24[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_007c20a0;
            puVar24 = puVar24 + -1;
            local_5a60 = pauVar31[-1];
            auVar60 = ZEXT3264(local_5a60);
            pauVar31 = pauVar31 + -1;
            local_5aa0 = vcmpps_avx512vl(local_5a60,auVar46,1);
          } while ((char)local_5aa0 == '\0');
          local_5ab0 = (ulong)(uint)POPCOUNT((int)local_5aa0);
          if (uVar30 < local_5ab0) {
LAB_007c1939:
            do {
              iVar19 = 4;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007c20a0;
                auVar47._4_4_ = uStack_583c;
                auVar47._0_4_ = local_5840;
                auVar47._8_4_ = uStack_5838;
                auVar47._12_4_ = uStack_5834;
                auVar47._16_4_ = uStack_5830;
                auVar47._20_4_ = uStack_582c;
                auVar47._24_4_ = uStack_5828;
                auVar47._28_4_ = uStack_5824;
                uVar12 = vcmpps_avx512vl(auVar47,auVar60._0_32_,6);
                if ((char)uVar12 == '\0') goto LAB_007c18f3;
                uVar20 = (ulong)((uint)root.ptr & 0xf);
                bVar26 = (byte)uVar33;
                bVar21 = bVar26;
                if (uVar20 == 8) goto LAB_007c1f9f;
                bVar21 = ~bVar26;
                pRVar1 = ray + 0x60;
                uStack_5a78 = *(undefined8 *)(ray + 0x68);
                uStack_5a70 = *(undefined8 *)(ray + 0x70);
                uStack_5a68 = *(undefined8 *)(ray + 0x78);
                uStack_5a7c = (undefined4)((ulong)*(undefined8 *)pRVar1 >> 0x20);
                auVar42 = *(undefined1 (*) [32])(ray + 0xa0);
                auVar41 = *(undefined1 (*) [32])(ray + 0xc0);
                auVar45 = *(undefined1 (*) [32])(ray + 0x80);
                lVar22 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar23 = 0;
                goto LAB_007c1b46;
              }
              lVar22 = 0;
              uVar20 = 8;
              auVar42 = auVar65._0_32_;
              do {
                uVar23 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar22 * 8);
                if (uVar23 == 8) {
                  auVar60 = ZEXT3264(auVar42);
                  break;
                }
                auVar59._4_4_ = fStack_591c;
                auVar59._0_4_ = local_5920;
                auVar59._8_4_ = fStack_5918;
                auVar59._12_4_ = fStack_5914;
                auVar59._16_4_ = fStack_5910;
                auVar59._20_4_ = fStack_590c;
                auVar59._24_4_ = fStack_5908;
                auVar59._28_4_ = uStack_5904;
                uVar2 = *(undefined4 *)(root.ptr + 0x40 + lVar22 * 4);
                auVar61._4_4_ = uVar2;
                auVar61._0_4_ = uVar2;
                auVar61._8_4_ = uVar2;
                auVar61._12_4_ = uVar2;
                auVar61._16_4_ = uVar2;
                auVar61._20_4_ = uVar2;
                auVar61._24_4_ = uVar2;
                auVar61._28_4_ = uVar2;
                auVar34 = vfmsub132ps_fma(auVar61,auVar59,local_5980);
                auVar14._4_4_ = fStack_58fc;
                auVar14._0_4_ = local_5900;
                auVar14._8_4_ = fStack_58f8;
                auVar14._12_4_ = fStack_58f4;
                auVar14._16_4_ = fStack_58f0;
                auVar14._20_4_ = fStack_58ec;
                auVar14._24_4_ = fStack_58e8;
                auVar14._28_4_ = uStack_58e4;
                uVar2 = *(undefined4 *)(root.ptr + 0x80 + lVar22 * 4);
                auVar62._4_4_ = uVar2;
                auVar62._0_4_ = uVar2;
                auVar62._8_4_ = uVar2;
                auVar62._12_4_ = uVar2;
                auVar62._16_4_ = uVar2;
                auVar62._20_4_ = uVar2;
                auVar62._24_4_ = uVar2;
                auVar62._28_4_ = uVar2;
                auVar15._4_4_ = fStack_58dc;
                auVar15._0_4_ = local_58e0;
                auVar15._8_4_ = fStack_58d8;
                auVar15._12_4_ = fStack_58d4;
                auVar15._16_4_ = fStack_58d0;
                auVar15._20_4_ = fStack_58cc;
                auVar15._24_4_ = fStack_58c8;
                auVar15._28_4_ = uStack_58c4;
                uVar2 = *(undefined4 *)(root.ptr + 0xc0 + lVar22 * 4);
                auVar63._4_4_ = uVar2;
                auVar63._0_4_ = uVar2;
                auVar63._8_4_ = uVar2;
                auVar63._12_4_ = uVar2;
                auVar63._16_4_ = uVar2;
                auVar63._20_4_ = uVar2;
                auVar63._24_4_ = uVar2;
                auVar63._28_4_ = uVar2;
                auVar35 = vfmsub132ps_fma(auVar62,auVar14,local_5960);
                auVar36 = vfmsub132ps_fma(auVar63,auVar15,local_5940);
                uVar2 = *(undefined4 *)(root.ptr + 0x60 + lVar22 * 4);
                auVar55._4_4_ = uVar2;
                auVar55._0_4_ = uVar2;
                auVar55._8_4_ = uVar2;
                auVar55._12_4_ = uVar2;
                auVar55._16_4_ = uVar2;
                auVar55._20_4_ = uVar2;
                auVar55._24_4_ = uVar2;
                auVar55._28_4_ = uVar2;
                auVar40 = vfmsub132ps_avx512vl(local_5980,auVar59,auVar55);
                uVar2 = *(undefined4 *)(root.ptr + 0xa0 + lVar22 * 4);
                auVar56._4_4_ = uVar2;
                auVar56._0_4_ = uVar2;
                auVar56._8_4_ = uVar2;
                auVar56._12_4_ = uVar2;
                auVar56._16_4_ = uVar2;
                auVar56._20_4_ = uVar2;
                auVar56._24_4_ = uVar2;
                auVar56._28_4_ = uVar2;
                auVar43 = vfmsub132ps_avx512vl(local_5960,auVar14,auVar56);
                uVar2 = *(undefined4 *)(root.ptr + 0xe0 + lVar22 * 4);
                auVar58._4_4_ = uVar2;
                auVar58._0_4_ = uVar2;
                auVar58._8_4_ = uVar2;
                auVar58._12_4_ = uVar2;
                auVar58._16_4_ = uVar2;
                auVar58._20_4_ = uVar2;
                auVar58._24_4_ = uVar2;
                auVar58._28_4_ = uVar2;
                auVar44 = vfmsub132ps_avx512vl(local_5940,auVar15,auVar58);
                auVar41 = vpminsd_avx2(ZEXT1632(auVar34),auVar40);
                auVar45 = vpminsd_avx2(ZEXT1632(auVar35),auVar43);
                auVar41 = vpmaxsd_avx2(auVar41,auVar45);
                auVar45 = vpminsd_avx2(ZEXT1632(auVar36),auVar44);
                auVar41 = vpmaxsd_avx2(auVar41,auVar45);
                auVar45 = vpmaxsd_avx2(ZEXT1632(auVar34),auVar40);
                auVar40 = vpmaxsd_avx2(ZEXT1632(auVar35),auVar43);
                auVar40 = vpminsd_avx2(auVar45,auVar40);
                auVar45 = vpmaxsd_avx2(ZEXT1632(auVar36),auVar44);
                auVar40 = vpminsd_avx2(auVar40,auVar45);
                auVar16._4_4_ = uStack_585c;
                auVar16._0_4_ = local_5860;
                auVar16._8_4_ = uStack_5858;
                auVar16._12_4_ = uStack_5854;
                auVar16._16_4_ = uStack_5850;
                auVar16._20_4_ = uStack_584c;
                auVar16._24_4_ = uStack_5848;
                auVar16._28_4_ = uStack_5844;
                auVar45 = vpmaxsd_avx2(auVar41,auVar16);
                auVar17._4_4_ = uStack_583c;
                auVar17._0_4_ = local_5840;
                auVar17._8_4_ = uStack_5838;
                auVar17._12_4_ = uStack_5834;
                auVar17._16_4_ = uStack_5830;
                auVar17._20_4_ = uStack_582c;
                auVar17._24_4_ = uStack_5828;
                auVar17._28_4_ = uStack_5824;
                auVar40 = vpminsd_avx2(auVar40,auVar17);
                uVar27 = vpcmpd_avx512vl(auVar45,auVar40,2);
                if ((byte)uVar27 == 0) {
                  auVar60 = ZEXT3264(auVar42);
                  uVar23 = uVar20;
                }
                else {
                  auVar45 = vblendmps_avx512vl(auVar65._0_32_,auVar41);
                  bVar32 = (bool)((byte)uVar27 & 1);
                  bVar5 = (bool)((byte)(uVar27 >> 1) & 1);
                  bVar6 = (bool)((byte)(uVar27 >> 2) & 1);
                  bVar7 = (bool)((byte)(uVar27 >> 3) & 1);
                  bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
                  bVar9 = (bool)((byte)(uVar27 >> 5) & 1);
                  bVar10 = (bool)((byte)(uVar27 >> 6) & 1);
                  bVar11 = SUB81(uVar27 >> 7,0);
                  auVar60 = ZEXT3264(CONCAT428((uint)bVar11 * auVar45._28_4_ |
                                               (uint)!bVar11 * auVar41._28_4_,
                                               CONCAT424((uint)bVar10 * auVar45._24_4_ |
                                                         (uint)!bVar10 * auVar41._24_4_,
                                                         CONCAT420((uint)bVar9 * auVar45._20_4_ |
                                                                   (uint)!bVar9 * auVar41._20_4_,
                                                                   CONCAT416((uint)bVar8 *
                                                                             auVar45._16_4_ |
                                                                             (uint)!bVar8 *
                                                                             auVar41._16_4_,
                                                                             CONCAT412((uint)bVar7 *
                                                                                       auVar45.
                                                  _12_4_ | (uint)!bVar7 * auVar41._12_4_,
                                                  CONCAT48((uint)bVar6 * auVar45._8_4_ |
                                                           (uint)!bVar6 * auVar41._8_4_,
                                                           CONCAT44((uint)bVar5 * auVar45._4_4_ |
                                                                    (uint)!bVar5 * auVar41._4_4_,
                                                                    (uint)bVar32 * auVar45._0_4_ |
                                                                    (uint)!bVar32 * auVar41._0_4_)))
                                                  )))));
                  if (uVar20 != 8) {
                    *puVar24 = uVar20;
                    puVar24 = puVar24 + 1;
                    *pauVar31 = auVar42;
                    pauVar31 = pauVar31 + 1;
                  }
                }
                uVar20 = uVar23;
                lVar22 = lVar22 + 1;
                auVar42 = auVar60._0_32_;
              } while (lVar22 != 8);
              if (uVar20 == 8) goto LAB_007c1aa4;
              auVar18._4_4_ = uStack_583c;
              auVar18._0_4_ = local_5840;
              auVar18._8_4_ = uStack_5838;
              auVar18._12_4_ = uStack_5834;
              auVar18._16_4_ = uStack_5830;
              auVar18._20_4_ = uStack_582c;
              auVar18._24_4_ = uStack_5828;
              auVar18._28_4_ = uStack_5824;
              uVar12 = vcmpps_avx512vl(auVar60._0_32_,auVar18,9);
              root.ptr = uVar20;
            } while ((byte)uVar30 < (byte)POPCOUNT((int)uVar12));
            *puVar24 = uVar20;
            puVar24 = puVar24 + 1;
            *pauVar31 = auVar60._0_32_;
            pauVar31 = pauVar31 + 1;
          }
          else {
            do {
              local_5a80 = (undefined4)uVar33;
              local_5aa8 = 0;
              for (uVar33 = local_5aa0; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000
                  ) {
                local_5aa8 = local_5aa8 + 1;
              }
              bVar32 = occluded1(local_5a90,local_5a98,root,local_5aa8,&local_5ac1,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,local_5ac0);
              bVar21 = (byte)(1 << ((uint)local_5aa8 & 0x1f));
              if (!bVar32) {
                bVar21 = 0;
              }
              bVar21 = (byte)local_5a80 | bVar21;
              uVar4 = CONCAT31((int3)((uint)local_5a80 >> 8),bVar21);
              uVar33 = (ulong)uVar4;
              local_5aa0 = local_5aa0 - 1 & local_5aa0;
            } while (local_5aa0 != 0);
            iVar19 = 3;
            if (bVar21 != 0xff) {
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5840 = (uint)(bVar21 & 1) * auVar42._0_4_ | !(bool)(bVar21 & 1) * local_5840;
              bVar32 = (bool)((byte)(uVar4 >> 1) & 1);
              uStack_583c = (uint)bVar32 * auVar42._4_4_ | !bVar32 * uStack_583c;
              bVar32 = (bool)((byte)(uVar4 >> 2) & 1);
              uStack_5838 = (uint)bVar32 * auVar42._8_4_ | !bVar32 * uStack_5838;
              bVar32 = (bool)((byte)(uVar4 >> 3) & 1);
              uStack_5834 = (uint)bVar32 * auVar42._12_4_ | !bVar32 * uStack_5834;
              bVar32 = (bool)((byte)(uVar4 >> 4) & 1);
              uStack_5830 = (uint)bVar32 * auVar42._16_4_ | !bVar32 * uStack_5830;
              bVar32 = (bool)((byte)(uVar4 >> 5) & 1);
              uStack_582c = (uint)bVar32 * auVar42._20_4_ | !bVar32 * uStack_582c;
              bVar32 = (bool)((byte)(uVar4 >> 6) & 1);
              uStack_5828 = (uint)bVar32 * auVar42._24_4_ | !bVar32 * uStack_5828;
              bVar32 = (bool)((byte)(uVar4 >> 7) & 1);
              uStack_5824 = (uint)bVar32 * auVar42._28_4_ | !bVar32 * uStack_5824;
              iVar19 = 2;
            }
            auVar65 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar60 = ZEXT3264(local_5a60);
            if ((uint)uVar30 < (uint)local_5ab0) goto LAB_007c1939;
          }
LAB_007c1aa4:
        } while (iVar19 != 3);
LAB_007c20a0:
        local_5ab4._0_1_ = (byte)uVar33 & (byte)local_5ab4;
        bVar32 = (bool)((byte)local_5ab4 >> 1 & 1);
        bVar5 = (bool)((byte)local_5ab4 >> 2 & 1);
        bVar6 = (bool)((byte)local_5ab4 >> 3 & 1);
        bVar7 = (bool)((byte)local_5ab4 >> 4 & 1);
        bVar8 = (bool)((byte)local_5ab4 >> 5 & 1);
        bVar9 = (bool)((byte)local_5ab4 >> 6 & 1);
        *(uint *)local_5a88 =
             (uint)((byte)local_5ab4 & 1) * -0x800000 |
             (uint)!(bool)((byte)local_5ab4 & 1) * *(int *)local_5a88;
        *(uint *)(local_5a88 + 4) =
             (uint)bVar32 * -0x800000 | (uint)!bVar32 * *(int *)(local_5a88 + 4);
        *(uint *)(local_5a88 + 8) =
             (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_5a88 + 8);
        *(uint *)(local_5a88 + 0xc) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5a88 + 0xc);
        *(uint *)(local_5a88 + 0x10) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5a88 + 0x10);
        *(uint *)(local_5a88 + 0x14) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5a88 + 0x14);
        *(uint *)(local_5a88 + 0x18) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5a88 + 0x18);
        *(uint *)(local_5a88 + 0x1c) =
             (uint)((byte)local_5ab4 >> 7) * -0x800000 |
             (uint)!(bool)((byte)local_5ab4 >> 7) * *(int *)(local_5a88 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar23 = uVar23 + 1;
    lVar22 = lVar22 + 0xe0;
    if (uVar20 - 8 <= uVar23) break;
LAB_007c1b46:
    uVar27 = 0;
    bVar25 = bVar21;
    while (uVar28 = (ulong)*(uint *)(lVar22 + uVar27 * 4), uVar28 != 0xffffffff) {
      auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0xc0 + uVar27 * 4)));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0xb0 + uVar27 * 4)));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0xa0 + uVar27 * 4)));
      uVar2 = *(undefined4 *)(lVar22 + -0x90 + uVar27 * 4);
      auVar34._4_4_ = uVar2;
      auVar34._0_4_ = uVar2;
      auVar34._8_4_ = uVar2;
      auVar34._12_4_ = uVar2;
      auVar64._16_4_ = uVar2;
      auVar64._0_16_ = auVar34;
      auVar64._20_4_ = uVar2;
      auVar64._24_4_ = uVar2;
      auVar64._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar22 + -0x80 + uVar27 * 4);
      auVar35._4_4_ = uVar2;
      auVar35._0_4_ = uVar2;
      auVar35._8_4_ = uVar2;
      auVar35._12_4_ = uVar2;
      auVar66._16_4_ = uVar2;
      auVar66._0_16_ = auVar35;
      auVar66._20_4_ = uVar2;
      auVar66._24_4_ = uVar2;
      auVar66._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar22 + -0x70 + uVar27 * 4);
      auVar36._4_4_ = uVar2;
      auVar36._0_4_ = uVar2;
      auVar36._8_4_ = uVar2;
      auVar36._12_4_ = uVar2;
      auVar67._16_4_ = uVar2;
      auVar67._0_16_ = auVar36;
      auVar67._20_4_ = uVar2;
      auVar67._24_4_ = uVar2;
      auVar67._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar22 + -0x30 + uVar27 * 4);
      auVar37._4_4_ = uVar2;
      auVar37._0_4_ = uVar2;
      auVar37._8_4_ = uVar2;
      auVar37._12_4_ = uVar2;
      auVar68._16_4_ = uVar2;
      auVar68._0_16_ = auVar37;
      auVar68._20_4_ = uVar2;
      auVar68._24_4_ = uVar2;
      auVar68._28_4_ = uVar2;
      uVar3 = *(undefined4 *)(lVar22 + -0x20 + uVar27 * 4);
      auVar38._4_4_ = uVar3;
      auVar38._0_4_ = uVar3;
      auVar38._8_4_ = uVar3;
      auVar38._12_4_ = uVar3;
      auVar69._16_4_ = uVar3;
      auVar69._0_16_ = auVar38;
      auVar69._20_4_ = uVar3;
      auVar69._24_4_ = uVar3;
      auVar69._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(lVar22 + -0x10 + uVar27 * 4);
      auVar39._4_4_ = uVar3;
      auVar39._0_4_ = uVar3;
      auVar39._8_4_ = uVar3;
      auVar39._12_4_ = uVar3;
      auVar70._16_4_ = uVar3;
      auVar70._0_16_ = auVar39;
      auVar70._20_4_ = uVar3;
      auVar70._24_4_ = uVar3;
      auVar70._28_4_ = uVar3;
      auVar34 = vsubss_avx512f(auVar40._0_16_,auVar34);
      auVar46 = vbroadcastss_avx512vl(auVar34);
      auVar35 = vsubss_avx512f(auVar43._0_16_,auVar35);
      auVar47 = vbroadcastss_avx512vl(auVar35);
      auVar36 = vsubss_avx512f(auVar44._0_16_,auVar36);
      auVar48 = vbroadcastss_avx512vl(auVar36);
      auVar37 = vsubss_avx512f(auVar37,auVar40._0_16_);
      auVar49 = vbroadcastss_avx512vl(auVar37);
      auVar38 = vsubss_avx512f(auVar38,auVar43._0_16_);
      auVar50 = vbroadcastss_avx512vl(auVar38);
      auVar39 = vsubss_avx512f(auVar39,auVar44._0_16_);
      auVar51 = vbroadcastss_avx512vl(auVar39);
      auVar35 = vmulss_avx512f(auVar35,auVar39);
      auVar52 = vbroadcastss_avx512vl(auVar35);
      auVar53 = vfmsub231ps_avx512vl(auVar52,auVar50,auVar48);
      auVar35 = vmulss_avx512f(auVar36,auVar37);
      auVar52 = vbroadcastss_avx512vl(auVar35);
      auVar54 = vfmsub231ps_avx512vl(auVar52,auVar51,auVar46);
      auVar34 = vmulss_avx512f(auVar34,auVar38);
      auVar52 = vbroadcastss_avx512vl(auVar34);
      auVar55 = vfmsub231ps_avx512vl(auVar52,auVar49,auVar47);
      auVar40 = vsubps_avx512vl(auVar40,*(undefined1 (*) [32])ray);
      auVar43 = vsubps_avx512vl(auVar43,*(undefined1 (*) [32])(ray + 0x20));
      auVar44 = vsubps_avx512vl(auVar44,*(undefined1 (*) [32])(ray + 0x40));
      auVar52 = vmulps_avx512vl(auVar42,auVar44);
      auVar56 = vfmsub231ps_avx512vl(auVar52,auVar43,auVar41);
      auVar52 = vmulps_avx512vl(auVar41,auVar40);
      auVar57 = vfmsub231ps_avx512vl(auVar52,auVar44,auVar45);
      auVar52 = vmulps_avx512vl(auVar45,auVar43);
      auVar58 = vfmsub231ps_avx512vl(auVar52,auVar40,auVar42);
      auVar52 = vmulps_avx512vl(auVar55,auVar41);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar54,auVar42);
      auVar59 = vfmadd231ps_avx512vl(auVar52,auVar53,auVar45);
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar52._16_4_ = 0x80000000;
      auVar52._20_4_ = 0x80000000;
      auVar52._24_4_ = 0x80000000;
      auVar52._28_4_ = 0x80000000;
      vandps_avx512vl(auVar59,auVar52);
      auVar52 = vmulps_avx512vl(auVar51,auVar58);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar57,auVar50);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar56,auVar49);
      auVar52 = vxorps_avx512vl(auVar59,auVar52);
      uVar12 = vcmpps_avx512vl(auVar52,_DAT_01faff00,5);
      bVar29 = (byte)uVar12 & bVar25;
      if (bVar29 != 0) {
        auVar48 = vmulps_avx512vl(auVar48,auVar58);
        auVar47 = vfmadd213ps_avx512vl(auVar47,auVar57,auVar48);
        auVar46 = vfmadd213ps_avx512vl(auVar46,auVar56,auVar47);
        auVar46 = vxorps_avx512vl(auVar59,auVar46);
        uVar12 = vcmpps_avx512vl(auVar46,_DAT_01faff00,5);
        bVar29 = bVar29 & (byte)uVar12;
        if (bVar29 != 0) {
          auVar48._8_4_ = 0x7fffffff;
          auVar48._0_8_ = 0x7fffffff7fffffff;
          auVar48._12_4_ = 0x7fffffff;
          auVar48._16_4_ = 0x7fffffff;
          auVar48._20_4_ = 0x7fffffff;
          auVar48._24_4_ = 0x7fffffff;
          auVar48._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar59,auVar48);
          auVar47 = vsubps_avx512vl(auVar46,auVar52);
          uVar12 = vcmpps_avx512vl(auVar47,auVar46,5);
          bVar29 = bVar29 & (byte)uVar12;
          if (bVar29 != 0) {
            auVar44 = vmulps_avx512vl(auVar55,auVar44);
            auVar43 = vfmadd213ps_avx512vl(auVar43,auVar54,auVar44);
            auVar40 = vfmadd213ps_avx512vl(auVar40,auVar53,auVar43);
            auVar40 = vxorps_avx512vl(auVar59,auVar40);
            auVar43 = vmulps_avx512vl(auVar46,*(undefined1 (*) [32])pRVar1);
            auVar44 = vmulps_avx512vl(auVar46,*(undefined1 (*) [32])(ray + 0x100));
            uVar12 = vcmpps_avx512vl(auVar40,auVar44,2);
            uVar13 = vcmpps_avx512vl(auVar43,auVar40,1);
            bVar29 = bVar29 & (byte)uVar12 & (byte)uVar13;
            if (bVar29 != 0) {
              uVar12 = vcmpps_avx512vl(auVar59,_DAT_01faff00,4);
              bVar29 = bVar29 & (byte)uVar12;
              if (bVar29 != 0) {
                uVar4 = ((local_5ac0->scene->geometries).items[uVar28].ptr)->mask;
                auVar49._4_4_ = uVar4;
                auVar49._0_4_ = uVar4;
                auVar49._8_4_ = uVar4;
                auVar49._12_4_ = uVar4;
                auVar49._16_4_ = uVar4;
                auVar49._20_4_ = uVar4;
                auVar49._24_4_ = uVar4;
                auVar49._28_4_ = uVar4;
                uVar12 = vptestmd_avx512vl(*(undefined1 (*) [32])(ray + 0x120),auVar49);
                bVar29 = bVar29 & (byte)uVar12;
                if (bVar29 != 0) {
                  bVar25 = bVar25 & ~bVar29;
                }
              }
            }
          }
        }
      }
      if (bVar25 == 0) {
        bVar25 = 0;
        auVar65 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        break;
      }
      uVar3 = *(undefined4 *)(lVar22 + -0x60 + uVar27 * 4);
      auVar57._4_4_ = uVar3;
      auVar57._0_4_ = uVar3;
      auVar57._8_4_ = uVar3;
      auVar57._12_4_ = uVar3;
      auVar57._16_4_ = uVar3;
      auVar57._20_4_ = uVar3;
      auVar57._24_4_ = uVar3;
      auVar57._28_4_ = uVar3;
      auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0x50 + uVar27 * 4)));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0x40 + uVar27 * 4)));
      auVar46 = vsubps_avx512vl(auVar57,auVar68);
      auVar47 = vsubps_avx512vl(auVar43,auVar69);
      auVar52 = vsubps_avx512vl(auVar44,auVar70);
      auVar48 = vsubps_avx512vl(auVar64,auVar57);
      auVar49 = vsubps_avx512vl(auVar66,auVar43);
      auVar53 = vsubps_avx512vl(auVar67,auVar44);
      auVar40 = vmulps_avx512vl(auVar47,auVar53);
      auVar54 = vfmsub231ps_avx512vl(auVar40,auVar49,auVar52);
      auVar40 = vmulps_avx512vl(auVar52,auVar48);
      auVar55 = vfmsub231ps_avx512vl(auVar40,auVar53,auVar46);
      auVar40 = vmulps_avx512vl(auVar46,auVar49);
      auVar56 = vfmsub231ps_avx512vl(auVar40,auVar48,auVar47);
      auVar40 = vsubps_avx(auVar57,*(undefined1 (*) [32])ray);
      auVar43 = vsubps_avx512vl(auVar43,*(undefined1 (*) [32])(ray + 0x20));
      auVar44 = vsubps_avx512vl(auVar44,*(undefined1 (*) [32])(ray + 0x40));
      auVar50 = vmulps_avx512vl(auVar42,auVar44);
      auVar57 = vfmsub231ps_avx512vl(auVar50,auVar43,auVar41);
      auVar50 = vmulps_avx512vl(auVar41,auVar40);
      auVar58 = vfmsub231ps_avx512vl(auVar50,auVar44,auVar45);
      auVar50 = vmulps_avx512vl(auVar45,auVar43);
      auVar59 = vfmsub231ps_avx512vl(auVar50,auVar40,auVar42);
      auVar51._4_4_ = auVar56._4_4_ * auVar41._4_4_;
      auVar51._0_4_ = auVar56._0_4_ * auVar41._0_4_;
      auVar51._8_4_ = auVar56._8_4_ * auVar41._8_4_;
      auVar51._12_4_ = auVar56._12_4_ * auVar41._12_4_;
      auVar51._16_4_ = auVar56._16_4_ * auVar41._16_4_;
      auVar51._20_4_ = auVar56._20_4_ * auVar41._20_4_;
      auVar51._24_4_ = auVar56._24_4_ * auVar41._24_4_;
      auVar51._28_4_ = uVar2;
      auVar34 = vfmadd231ps_fma(auVar51,auVar55,auVar42);
      auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar54,auVar45);
      auVar50._8_4_ = 0x80000000;
      auVar50._0_8_ = 0x8000000080000000;
      auVar50._12_4_ = 0x80000000;
      auVar50._16_4_ = 0x80000000;
      auVar50._20_4_ = 0x80000000;
      auVar50._24_4_ = 0x80000000;
      auVar50._28_4_ = 0x80000000;
      vandps_avx512vl(ZEXT1632(auVar34),auVar50);
      auVar50 = vmulps_avx512vl(auVar53,auVar59);
      auVar49 = vfmadd231ps_avx512vl(auVar50,auVar58,auVar49);
      auVar48 = vfmadd231ps_avx512vl(auVar49,auVar57,auVar48);
      auVar48 = vxorps_avx512vl(auVar59,auVar48);
      uVar12 = vcmpps_avx512vl(auVar48,_DAT_01faff00,5);
      bVar29 = (byte)uVar12 & bVar25;
      if (bVar29 != 0) {
        auVar52 = vmulps_avx512vl(auVar52,auVar59);
        auVar47 = vfmadd213ps_avx512vl(auVar47,auVar58,auVar52);
        auVar46 = vfmadd213ps_avx512vl(auVar46,auVar57,auVar47);
        auVar46 = vxorps_avx512vl(auVar59,auVar46);
        uVar12 = vcmpps_avx512vl(auVar46,_DAT_01faff00,5);
        bVar29 = bVar29 & (byte)uVar12;
        if (bVar29 != 0) {
          auVar53._8_4_ = 0x7fffffff;
          auVar53._0_8_ = 0x7fffffff7fffffff;
          auVar53._12_4_ = 0x7fffffff;
          auVar53._16_4_ = 0x7fffffff;
          auVar53._20_4_ = 0x7fffffff;
          auVar53._24_4_ = 0x7fffffff;
          auVar53._28_4_ = 0x7fffffff;
          vandps_avx512vl(ZEXT1632(auVar34),auVar53);
          auVar47 = vsubps_avx512vl(auVar46,auVar48);
          uVar12 = vcmpps_avx512vl(auVar47,auVar46,5);
          bVar29 = bVar29 & (byte)uVar12;
          if (bVar29 != 0) {
            auVar44 = vmulps_avx512vl(auVar56,auVar44);
            auVar35 = vfmadd213ps_fma(auVar43,auVar55,auVar44);
            auVar35 = vfmadd213ps_fma(auVar40,auVar54,ZEXT1632(auVar35));
            auVar40 = vxorps_avx512vl(auVar59,ZEXT1632(auVar35));
            auVar43 = vmulps_avx512vl(auVar46,*(undefined1 (*) [32])pRVar1);
            auVar44 = vmulps_avx512vl(auVar46,*(undefined1 (*) [32])(ray + 0x100));
            uVar12 = vcmpps_avx512vl(auVar40,auVar44,2);
            uVar13 = vcmpps_avx512vl(auVar43,auVar40,1);
            bVar29 = bVar29 & (byte)uVar12 & (byte)uVar13;
            if (bVar29 != 0) {
              uVar12 = vcmpps_avx512vl(ZEXT1632(auVar34),_DAT_01faff00,4);
              bVar29 = bVar29 & (byte)uVar12;
              if (bVar29 != 0) {
                uVar4 = ((local_5ac0->scene->geometries).items[uVar28].ptr)->mask;
                auVar54._4_4_ = uVar4;
                auVar54._0_4_ = uVar4;
                auVar54._8_4_ = uVar4;
                auVar54._12_4_ = uVar4;
                auVar54._16_4_ = uVar4;
                auVar54._20_4_ = uVar4;
                auVar54._24_4_ = uVar4;
                auVar54._28_4_ = uVar4;
                uVar12 = vptestmd_avx512vl(*(undefined1 (*) [32])(ray + 0x120),auVar54);
                bVar29 = bVar29 & (byte)uVar12;
                if (bVar29 != 0) {
                  bVar25 = bVar25 & ~bVar29;
                }
              }
            }
          }
        }
      }
      auVar65 = ZEXT3264(CONCAT428(0x7f800000,
                                   CONCAT424(0x7f800000,
                                             CONCAT420(0x7f800000,
                                                       CONCAT416(0x7f800000,
                                                                 CONCAT412(0x7f800000,
                                                                           CONCAT48(0x7f800000,
                                                                                                                                                                        
                                                  0x7f8000007f800000)))))));
      if ((bVar25 == 0) || (bVar32 = 2 < uVar27, uVar27 = uVar27 + 1, bVar32)) break;
    }
    bVar21 = bVar21 & bVar25;
    if (bVar21 == 0) break;
  }
  bVar21 = ~bVar21;
LAB_007c1f9f:
  bVar26 = bVar26 | bVar21;
  uVar33 = CONCAT71((int7)(uVar33 >> 8),bVar26);
  if (bVar26 == 0xff) {
    uVar33 = 0xff;
    goto LAB_007c20a0;
  }
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5840 = (uint)(bVar26 & 1) * auVar42._0_4_ | !(bool)(bVar26 & 1) * local_5840;
  bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
  uStack_583c = (uint)bVar32 * auVar42._4_4_ | !bVar32 * uStack_583c;
  bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
  uStack_5838 = (uint)bVar32 * auVar42._8_4_ | !bVar32 * uStack_5838;
  bVar32 = (bool)((byte)(uVar33 >> 3) & 1);
  uStack_5834 = (uint)bVar32 * auVar42._12_4_ | !bVar32 * uStack_5834;
  bVar32 = (bool)((byte)(uVar33 >> 4) & 1);
  uStack_5830 = (uint)bVar32 * auVar42._16_4_ | !bVar32 * uStack_5830;
  bVar32 = (bool)((byte)(uVar33 >> 5) & 1);
  uStack_582c = (uint)bVar32 * auVar42._20_4_ | !bVar32 * uStack_582c;
  bVar32 = (bool)((byte)(uVar33 >> 6) & 1);
  uStack_5828 = (uint)bVar32 * auVar42._24_4_ | !bVar32 * uStack_5828;
  bVar32 = (bool)((byte)(uVar33 >> 7) & 1);
  uStack_5824 = (uint)bVar32 * auVar42._28_4_ | !bVar32 * uStack_5824;
  goto LAB_007c18f3;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }